

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

Vec_Int_t * Gia_GenCollectFlopIndexes(char *pStr,int nLutNum,int nLutSize,int nFlops)

{
  uint uVar1;
  int iVar2;
  int iFlop;
  Vec_Int_t *vFlops;
  char *pTemp;
  int nDups;
  int nFlops_local;
  int nLutSize_local;
  int nLutNum_local;
  char *pStr_local;
  
  if (nFlops < nLutSize * nLutNum) {
    __assert_fail("nLutSize * nLutNum <= nFlops",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaQbf.c"
                  ,0x49,"Vec_Int_t *Gia_GenCollectFlopIndexes(char *, int, int, int)");
  }
  if (pStr == (char *)0x0) {
    pStr_local = (char *)Vec_IntStartNatural(nLutNum * nLutSize);
  }
  else {
    pStr_local = (char *)Vec_IntAlloc(nLutNum * nLutSize);
    vFlops = (Vec_Int_t *)strtok(pStr,", ");
    while (vFlops != (Vec_Int_t *)0x0) {
      uVar1 = atoi((char *)vFlops);
      if (nFlops <= (int)uVar1) {
        printf("Flop index (%d) exceeds the number of flops (%d).\n",(ulong)uVar1,
               (ulong)(uint)nFlops);
        break;
      }
      Vec_IntPush((Vec_Int_t *)pStr_local,uVar1);
      vFlops = (Vec_Int_t *)strtok((char *)0x0,", ");
    }
    iVar2 = Vec_IntSize((Vec_Int_t *)pStr_local);
    if (iVar2 == nLutNum * nLutSize) {
      uVar1 = Vec_IntCountDuplicates((Vec_Int_t *)pStr_local);
      if (uVar1 != 0) {
        printf("Gia_GenCollectFlopIndexes: There are %d duplicated flops in the list.\n",
               (ulong)uVar1);
        Vec_IntFree((Vec_Int_t *)pStr_local);
        pStr_local = (char *)0x0;
      }
    }
    else {
      uVar1 = Vec_IntSize((Vec_Int_t *)pStr_local);
      printf("Gia_GenCollectFlopIndexes: Expecting %d flop indexes (instead of %d).\n",
             (ulong)(uint)(nLutNum * nLutSize),(ulong)uVar1);
      Vec_IntFree((Vec_Int_t *)pStr_local);
      pStr_local = (char *)0x0;
    }
  }
  return (Vec_Int_t *)pStr_local;
}

Assistant:

Vec_Int_t * Gia_GenCollectFlopIndexes( char * pStr, int nLutNum, int nLutSize, int nFlops )
{
    int nDups;
    char * pTemp;
    Vec_Int_t * vFlops;
    assert( nLutSize * nLutNum <= nFlops );
    if ( pStr == NULL )
        return Vec_IntStartNatural( nLutNum * nLutSize );
    vFlops = Vec_IntAlloc( nLutNum * nLutSize );
    pTemp = strtok( pStr, ", " );
    while ( pTemp )
    {
        int iFlop = atoi(pTemp);
        if ( iFlop >= nFlops )
        {
            printf( "Flop index (%d) exceeds the number of flops (%d).\n", iFlop, nFlops );
            break;
        }
        Vec_IntPush( vFlops, iFlop );
        pTemp = strtok( NULL, ", " );
    }
    if ( Vec_IntSize(vFlops) != nLutNum * nLutSize )
    {
        printf( "Gia_GenCollectFlopIndexes: Expecting %d flop indexes (instead of %d).\n", nLutNum * nLutSize, Vec_IntSize(vFlops) );
        Vec_IntFree( vFlops );
        return NULL;
    }
    nDups = Vec_IntCountDuplicates(vFlops);
    if ( nDups )
    {
        printf( "Gia_GenCollectFlopIndexes: There are %d duplicated flops in the list.\n", nDups );
        Vec_IntFree( vFlops );
        return NULL;
    }
    return vFlops;
}